

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

Bond * __thiscall
OpenMD::MoleculeCreator::createBond
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,BondStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  pointer ppAVar1;
  Atom *atom1;
  Atom *atom2;
  _Alloc_hider _Var2;
  int iVar3;
  BondType *bt;
  Bond *this_00;
  uint base;
  string s;
  string local_d8;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  BondTypeParser btParser;
  
  BondTypeParser::BondTypeParser(&btParser);
  ppAVar1 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  atom1 = ppAVar1[(uint)stamp->a];
  atom2 = ppAVar1[(uint)stamp->b];
  if (stamp->hasOverride_ == true) {
    std::__cxx11::string::string((string *)&s,(string *)&stamp->orType_);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_b8,&stamp->orPars_);
    bt = BondTypeParser::parseTypeAndPars
                   (&btParser,&s,(vector<double,_std::allocator<double>_> *)&local_b8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
    std::__cxx11::string::~string((string *)&s);
  }
  else {
    (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&s,atom1);
    (*(atom2->super_StuntDouble)._vptr_StuntDouble[7])(&local_d8,atom2);
    bt = ForceField::getBondType(ff,&s,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&s);
    if (bt == (BondType *)0x0) {
      (*(atom1->super_StuntDouble)._vptr_StuntDouble[7])(&s,atom1);
      _Var2 = s._M_dataplus;
      (*(atom2->super_StuntDouble)._vptr_StuntDouble[7])(&local_d8,atom2);
      bt = (BondType *)0x0;
      snprintf(painCave.errMsg,2000,"Can not find Matching Bond Type for[%s, %s]",_Var2._M_p,
               local_d8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&s);
      painCave.isFatal = 1;
      simError();
    }
  }
  this_00 = (Bond *)operator_new(0x98);
  Bond::Bond(this_00,atom1,atom2,bt);
  base = (uint)bt;
  iVar3 = IndexListContainer::pop(&localIndexMan->bondIndexContainer_);
  (this_00->super_ShortRangeInteraction).localIndex_ = iVar3;
  OpenMD_itoa_abi_cxx11_
            (&s,(OpenMD *)
                ((ulong)((long)(mol->bonds_).
                               super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(mol->bonds_).
                              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3),10,base);
  Molecule::getType_abi_cxx11_(&local_a0,mol);
  std::operator+(&local_80,&local_a0,"_Bond_");
  std::operator+(&local_d8,&local_80,s._M_dataplus._M_p);
  (*(this_00->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(this_00,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&s);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::BondTypeParser::BondTypeEnum>_>_>
               *)&btParser);
  return this_00;
}

Assistant:

Bond* MoleculeCreator::createBond(ForceField* ff, Molecule* mol,
                                    BondStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    BondTypeParser btParser;
    BondType* bondType = NULL;
    Atom* atomA;
    Atom* atomB;

    atomA = mol->getAtomAt(stamp->getA());
    atomB = mol->getAtomAt(stamp->getB());

    assert(atomA && atomB);

    if (stamp->hasOverride()) {
      try {
        bondType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                             stamp->getOverridePars());
      } catch (OpenMDException& e) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoleculeCreator Error: %s "
                 "for molecule %s\n",
                 e.what(), mol->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }

    } else {
      bondType = ff->getBondType(atomA->getType(), atomB->getType());

      if (bondType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Matching Bond Type for[%s, %s]",
                 atomA->getType().c_str(), atomB->getType().c_str());

        painCave.isFatal = 1;
        simError();
      }
    }

    Bond* bond = new Bond(atomA, atomB, bondType);

    // set the local index of this bond, the global index will be set later
    bond->setLocalIndex(localIndexMan->getNextBondIndex());

    // The rule for naming a bond is: MoleculeName_Bond_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Bond"
    // The third part is the index of the bond defined in meta-data file
    // For example, Butane_bond_0 is a valid Bond name in a butane molecule

    std::string s = OpenMD_itoa(mol->getNBonds(), 10);
    bond->setName(mol->getType() + "_Bond_" + s.c_str());
    return bond;
  }